

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connection.cpp
# Opt level: O2

void __thiscall cube::net::TcpConnection::CloseAfter(TcpConnection *this,int64_t delay_ms)

{
  EventLoop *this_00;
  _Bind<void_(cube::net::TcpConnection::*(std::shared_ptr<cube::net::TcpConnection>))()> local_80;
  Task local_60;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  EventLoop::AssertInLoopThread(this->m_event_loop);
  this_00 = this->m_event_loop;
  std::__shared_ptr<cube::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cube::net::TcpConnection,void>
            ((__shared_ptr<cube::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)&local_40,
             (__weak_ptr<cube::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
  local_80._M_f = (offset_in_TcpConnection_to_subr)Close;
  local_80._8_8_ = 0;
  local_80._M_bound_args.super__Tuple_impl<0UL,_std::shared_ptr<cube::net::TcpConnection>_>.
  super__Head_base<0UL,_std::shared_ptr<cube::net::TcpConnection>,_false>._M_head_impl.
  super___shared_ptr<cube::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_40;
  local_80._M_bound_args.super__Tuple_impl<0UL,_std::shared_ptr<cube::net::TcpConnection>_>.
  super__Head_base<0UL,_std::shared_ptr<cube::net::TcpConnection>,_false>._M_head_impl.
  super___shared_ptr<cube::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_38._M_pi;
  local_40 = (element_type *)0x0;
  _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::function<void()>::
  function<std::_Bind<void(cube::net::TcpConnection::*(std::shared_ptr<cube::net::TcpConnection>))()>,void>
            ((function<void()> *)&local_60,&local_80);
  EventLoop::RunAfter(this_00,&local_60,delay_ms);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_80._M_bound_args.
                     super__Tuple_impl<0UL,_std::shared_ptr<cube::net::TcpConnection>_>.
                     super__Head_base<0UL,_std::shared_ptr<cube::net::TcpConnection>,_false>.
                     _M_head_impl.
                     super___shared_ptr<cube::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38);
  return;
}

Assistant:

void TcpConnection::CloseAfter(int64_t delay_ms) {
    m_event_loop->AssertInLoopThread();
    m_event_loop->RunAfter(std::bind(&TcpConnection::Close, shared_from_this()), delay_ms);
}